

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O1

ostream * MinVR::operator<<(ostream *os,VRVector3 *v)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
  poVar1 = std::ostream::_M_insert<double>((double)v->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)v->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)v->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  return poVar1;
}

Assistant:

std::ostream & operator<< ( std::ostream &os, const VRVector3 &v) {
  return os << "<" << v.x << ", " << v.y << ", " << v.z << ">";
}